

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

void __thiscall
mp::InvalidOptionValue::InvalidOptionValue<int>
          (InvalidOptionValue *this,SolverOption *opt,int value,StringRef msg)

{
  StringRef msg_00;
  undefined8 in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R8;
  BasicStringRef<char> *in_stack_ffffffffffffff70;
  BasicCStringRef<char> *this_00;
  OptionError *in_stack_ffffffffffffff78;
  CStringRef in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff98;
  StringRef in_stack_ffffffffffffffa0;
  BasicCStringRef<char> local_50 [8];
  int iStack_c;
  char *pcStack_8;
  
  iStack_c = (int)((ulong)in_RCX >> 0x20);
  pcStack_8 = in_R8;
  SolverOption::name((SolverOption *)0x4faebe);
  fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff70,(char *)in_RDI);
  this_00 = local_50;
  msg_00.size_ = in_stack_ffffffffffffff98;
  msg_00.data_ = pcStack_8;
  Format<int>(in_stack_ffffffffffffffa0,iStack_c,msg_00);
  fmt::BasicCStringRef<char>::BasicCStringRef(this_00,in_RDI);
  OptionError::OptionError(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string((string *)local_50);
  *(undefined ***)in_RDI = &PTR__InvalidOptionValue_006e5ae0;
  return;
}

Assistant:

InvalidOptionValue(const SolverOption &opt, T value, fmt::StringRef msg="")
    : OptionError(Format(opt.name(), value, msg)) {}